

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.h
# Opt level: O2

Index __thiscall wabt::BindingHash::FindIndex(BindingHash *this,string_view name)

{
  Index IVar1;
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_30,&local_40,&local_41);
  IVar1 = FindIndex(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return IVar1;
}

Assistant:

Index FindIndex(std::string_view name) const {
    return FindIndex(std::string(name));
  }